

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall sznet::Logger::Impl::formatTime(Impl *this)

{
  int iVar1;
  int64_t iVar2;
  long n;
  sznet *this_00;
  char *str;
  long *plVar3;
  long *in_FS_OFFSET;
  T v;
  T v_00;
  T local_a8;
  T local_98;
  undefined1 local_88 [8];
  Fmt us;
  int len;
  tm tm_time;
  int microSeconds;
  time_t seconds;
  int64_t microSecondsSinceEpoch;
  Impl *this_local;
  
  iVar2 = Timestamp::microSecondsSinceEpoch(&this->m_time);
  n = iVar2 / 1000000;
  plVar3 = (long *)(*in_FS_OFFSET + -0x240);
  if (n != *plVar3) {
    *(long *)(*in_FS_OFFSET + -0x240) = n;
    sz_localtime((tm *)&us.m_length,n);
    plVar3 = (long *)(ulong)(tm_time.tm_mday + 0x76c);
    us.m_buf._28_4_ =
         snprintf((char *)(*in_FS_OFFSET + -0x280),0x40,"%4d%02d%02d %02d:%02d:%02d",plVar3,
                  (ulong)(tm_time.tm_hour + 1),(ulong)(uint)tm_time.tm_min,tm_time.tm_sec,len,
                  us.m_length);
    if (us.m_buf._28_4_ != 0x11) {
      __assert_fail("len == 17",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/log/Logging.cpp"
                    ,0x89,"void sznet::Logger::Impl::formatTime()");
    }
    us.m_buf[0x1c] = '\x11';
    us.m_buf[0x1d] = '\0';
    us.m_buf[0x1e] = '\0';
    us.m_buf[0x1f] = '\0';
  }
  Fmt::Fmt<int>((Fmt *)local_88,".%06d ",(int)(iVar2 % 1000000));
  iVar1 = Fmt::length((Fmt *)local_88);
  if (iVar1 == 8) {
    T::T(&local_98,(char *)(*in_FS_OFFSET + -0x280),0x11);
    v.m_str = (char *)(ulong)local_98.m_len;
    v._8_8_ = plVar3;
    this_00 = (sznet *)sznet::operator<<((sznet *)&this->m_stream,(LogStream *)local_98.m_str,v);
    str = Fmt::data((Fmt *)local_88);
    T::T(&local_a8,str,8);
    v_00.m_str = (char *)(ulong)local_a8.m_len;
    v_00._8_8_ = plVar3;
    sznet::operator<<(this_00,(LogStream *)local_a8.m_str,v_00);
    return;
  }
  __assert_fail("us.length() == 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/log/Logging.cpp"
                ,0x8d,"void sznet::Logger::Impl::formatTime()");
}

Assistant:

void Logger::Impl::formatTime()
{
	int64_t microSecondsSinceEpoch = m_time.microSecondsSinceEpoch();
	time_t seconds = static_cast<time_t>(microSecondsSinceEpoch / Timestamp::kMicroSecondsPerSecond);
	int microSeconds = static_cast<int>(microSecondsSinceEpoch % Timestamp::kMicroSecondsPerSecond);
	if (seconds != t_lastSecond)
	{
		t_lastSecond = seconds;
		struct tm tm_time;
		sz_localtime(tm_time, seconds);
		int len = snprintf(t_time, sizeof(t_time), "%4d%02d%02d %02d:%02d:%02d",
			tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
			tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
		assert(len == 17);
		(void)len;
	}
	Fmt us(".%06d ", microSeconds);
	assert(us.length() == 8);
	m_stream << T(t_time, 17) << T(us.data(), 8);
}